

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dispatch.cpp
# Opt level: O0

void __thiscall ac::core::cpu::dispatch::detail::ISA::ISA(ISA *this)

{
  int iVar1;
  long in_RDI;
  char *in_stack_ffffffffffffffe8;
  
  ruapu_init();
  iVar1 = ruapu_supports(in_stack_ffffffffffffffe8);
  *(bool *)in_RDI = iVar1 != 0;
  iVar1 = ruapu_supports(in_stack_ffffffffffffffe8);
  *(bool *)(in_RDI + 1) = iVar1 != 0;
  iVar1 = ruapu_supports(in_stack_ffffffffffffffe8);
  *(bool *)(in_RDI + 2) = iVar1 != 0;
  iVar1 = ruapu_supports(in_stack_ffffffffffffffe8);
  *(bool *)(in_RDI + 3) = iVar1 != 0;
  return;
}

Assistant:

ISA() noexcept
        {
            ruapu_init();
            sse = ruapu_supports("sse3");
            avx = ruapu_supports("avx");
            fma = ruapu_supports("fma");
            neon = ruapu_supports("neon");
        }